

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
::reserve(vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
          *this,size_t n)

{
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar1;
  ulong in_RSI;
  vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
  *in_RDI;
  int i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *ra;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffc8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pvVar1 = pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
             ::allocate_object<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                       ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
                         *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pvVar1 + local_1c;
      begin(in_RDI);
      pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>::
      construct<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x8424d2);
      begin(in_RDI);
      pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>::
      destroy<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
                ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    pmr::polymorphic_allocator<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>::
    deallocate_object<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>
                *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x842514);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pvVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }